

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::IRRImporter::CanRead(IRRImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [1];
  string local_48;
  char *local_28;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  bVar1 = true;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        local_28 = "irr_scene";
        bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_28,1,200,false,false)
        ;
      }
    }
    else {
      bVar1 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool IRRImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    const std::string extension = GetExtension(pFile);
    if ( extension == "irr" ) {
        return true;
    } else if (extension == "xml" || checkSig) {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be nullptr and it's our duty to return true here.
         */
        if (nullptr == pIOHandler ) {
            return true;
        }
        const char* tokens[] = {"irr_scene"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }

    return false;
}